

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.hpp
# Opt level: O2

void kernel_to_references<double,int>
               (TreesIndexer *indexer,IsoForest *model_outputs,ExtIsoForest *model_outputs_ext,
               double *numeric_data,int *categ_data,double *Xc,int *Xc_ind,int *Xc_indptr,
               bool is_col_major,size_t ld_numeric,size_t ld_categ,size_t nrows,int nthreads,
               double *rmat,bool standardize)

{
  pointer pSVar1;
  long lVar2;
  ulong uVar3;
  int *Xc_indptr_00;
  bool bVar4;
  unique_ptr<int[],_std::default_delete<int[]>_> uVar5;
  size_t tree;
  long lVar6;
  size_t __n;
  __uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true> tree_num;
  long lVar7;
  long lVar8;
  ulong uVar9;
  double *pdVar10;
  long lVar11;
  double *pdVar12;
  double *Xr_indptr;
  size_t row;
  size_t sVar13;
  int *Xc_ind_00;
  undefined1 auVar14 [16];
  unique_ptr<double[],_std::default_delete<double[]>_> ignored;
  unique_ptr<int[],_std::default_delete<int[]>_> terminal_indices;
  SignalSwitcher ss;
  
  pSVar1 = (indexer->indices).super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar6 = ((long)(indexer->indices).
                 super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pSVar1) / 0x98;
  __n = (long)*(pointer *)
               ((long)&(pSVar1->reference_points).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + 8) -
        *(long *)&(pSVar1->reference_points).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl;
  SignalSwitcher::SignalSwitcher(&ss);
  tree_num.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)
                 operator_new__(-(ulong)(lVar6 * nrows >> 0x3e != 0) | lVar6 * nrows * 4);
  terminal_indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                 (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                 tree_num.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl;
  ignored._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       operator_new__(-(ulong)(nrows >> 0x3d != 0) | nrows * 8);
  pdVar10 = (double *)0x0;
  pdVar12 = (double *)0x0;
  if (is_col_major) {
    pdVar12 = Xc;
  }
  Xc_ind_00 = (int *)0x0;
  if (is_col_major) {
    Xc_ind_00 = Xc_ind;
  }
  Xr_indptr = (double *)Xc_indptr;
  Xc_indptr_00 = (int *)0x0;
  if (is_col_major) {
    Xr_indptr = pdVar10;
    Xc = pdVar10;
    Xc_indptr_00 = Xc_indptr;
    Xc_ind = (int *)pdVar10;
  }
  predict_iforest<double,int>
            (numeric_data,categ_data,is_col_major,ld_numeric,ld_categ,pdVar12,Xc_ind_00,Xc_indptr_00
             ,Xc,Xc_ind,(int *)Xr_indptr,nrows,nthreads,false,model_outputs,model_outputs_ext,
             (double *)
             ignored._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
             super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
             super__Head_base<0UL,_double_*,_false>._M_head_impl,
             (int *)tree_num.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                    super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                    super__Head_base<0UL,_int_*,_false>._M_head_impl,(double *)0x0,indexer);
  std::__uniq_ptr_impl<double,_std::default_delete<double[]>_>::reset
            ((__uniq_ptr_impl<double,_std::default_delete<double[]>_> *)&ignored,(pointer)0x0);
  check_interrupt_switch(&ss);
  uVar5 = terminal_indices;
  bVar4 = interrupt_switch;
  lVar7 = (long)__n >> 3;
  pSVar1 = (indexer->indices).super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
           _M_impl.super__Vector_impl_data._M_start;
  for (sVar13 = 0; sVar13 != nrows; sVar13 = sVar13 + 1) {
    if ((bVar4 & 1U) == 0) {
      pdVar12 = rmat + sVar13 * lVar7;
      memset(pdVar12,0,__n);
      for (lVar8 = 0; lVar8 != lVar6; lVar8 = lVar8 + 1) {
        lVar11 = (long)*(int *)((long)uVar5._M_t.
                                      super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                                      super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                                      super__Head_base<0UL,_int_*,_false>._M_head_impl + sVar13 * 4
                               + lVar8 * nrows * 4);
        lVar2 = *(long *)&pSVar1[lVar8].reference_indptr.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
        uVar3 = *(ulong *)(lVar2 + 8 + lVar11 * 8);
        for (uVar9 = *(ulong *)(lVar2 + lVar11 * 8); uVar9 < uVar3; uVar9 = uVar9 + 1) {
          lVar2 = *(long *)(*(long *)&pSVar1[lVar8].reference_mapping.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl + uVar9 * 8);
          pdVar12[lVar2] = pdVar12[lVar2] + 1.0;
        }
      }
    }
  }
  check_interrupt_switch(&ss);
  if (standardize) {
    auVar14._8_4_ = (int)((ulong)lVar6 >> 0x20);
    auVar14._0_8_ = lVar6;
    auVar14._12_4_ = 0x45300000;
    for (lVar8 = 0; lVar7 * nrows - lVar8 != 0; lVar8 = lVar8 + 1) {
      rmat[lVar8] = rmat[lVar8] /
                    ((auVar14._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0));
    }
  }
  check_interrupt_switch(&ss);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&ignored);
  std::unique_ptr<int[],_std::default_delete<int[]>_>::~unique_ptr(&terminal_indices);
  SignalSwitcher::~SignalSwitcher(&ss);
  return;
}

Assistant:

void kernel_to_references(TreesIndexer &indexer,
                          IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
                          real_t *restrict numeric_data, int *restrict categ_data,
                          real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                          bool is_col_major, size_t ld_numeric, size_t ld_categ,
                          size_t nrows, int nthreads,
                          double *restrict rmat,
                          bool standardize)
{
    size_t ntrees = indexer.indices.size();
    size_t n_ref = indexer.indices.front().reference_points.size();

    SignalSwitcher ss;

    std::unique_ptr<sparse_ix[]> terminal_indices(new sparse_ix[nrows*ntrees]);
    std::unique_ptr<double[]> ignored(new double[nrows]);
    predict_iforest(numeric_data, categ_data,
                    is_col_major, ld_numeric, ld_categ,
                    is_col_major? Xc : nullptr, is_col_major? Xc_ind : nullptr, is_col_major? Xc_indptr : nullptr,
                    is_col_major? (real_t*)nullptr : Xc, is_col_major? (sparse_ix*)nullptr : Xc_ind, is_col_major? (sparse_ix*)nullptr : Xc_indptr,
                    nrows, nthreads, false,
                    model_outputs, model_outputs_ext,
                    ignored.get(), terminal_indices.get(),
                    (double*)NULL,
                    &indexer);
    ignored.reset();

    check_interrupt_switch(ss);

    #pragma omp parallel for schedule(static) num_threads(nthreads) \
            shared(indexer, terminal_indices, nrows, ntrees, n_ref, rmat)
    for (size_t_for row = 0; row < (decltype(row))nrows; row++)
    {
        if (interrupt_switch) continue;

        SingleTreeIndex *restrict index_node;
        size_t idx_this;
        sparse_ix *restrict terminal_indices_this = terminal_indices.get() + row;
        double *restrict rmat_this = rmat + row*n_ref;
        memset(rmat_this, 0, n_ref*sizeof(double));

        for (size_t tree = 0; tree < ntrees; tree++)
        {
            idx_this = terminal_indices_this[tree*nrows];
            index_node = &indexer.indices[tree];
            for (size_t ind = index_node->reference_indptr[idx_this];
                 ind < index_node->reference_indptr[idx_this + 1];
                 ind++)
            {
                rmat_this[index_node->reference_mapping[ind]]++;
            }
        }
    }

    check_interrupt_switch(ss);

    if (standardize)
    {
        double ntrees_dbl = (double)ntrees;
        for (size_t ix = 0; ix < nrows*n_ref; ix++)
            rmat[ix] /= ntrees_dbl;
    }

    check_interrupt_switch(ss);
}